

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerMSL::add_plain_member_variable_to_interface_block
          (CompilerMSL *this,StorageClass storage,string *ib_var_ref,SPIRType *ib_type,
          SPIRVariable *var,SPIRType *var_type,uint32_t mbr_idx,InterfaceBlockMeta *meta,
          string *mbr_name_qual,string *var_chain_qual,uint32_t *location,uint32_t *var_mbr_idx)

{
  char *pcVar1;
  size_t sVar2;
  pointer pcVar3;
  Variant *pVVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  size_type sVar10;
  long *plVar11;
  undefined8 *puVar12;
  SPIRType *pSVar13;
  ulong uVar14;
  SPIRConstant *pSVar15;
  _func_int ***ppp_Var16;
  size_type sVar17;
  mapped_type *pmVar18;
  size_type *psVar19;
  CompilerMSL *pCVar20;
  undefined1 auVar21 [8];
  _func_int **pp_Var22;
  char (*ts_2) [2];
  byte bVar23;
  string var_chain;
  string qual_var_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string mbr_name;
  bool local_2a7;
  bool local_2a5;
  bool local_29d;
  uint local_29c;
  BuiltIn local_28c;
  SPIRType *local_288;
  CompilerMSL *local_280;
  _Any_data local_278;
  _func_int **local_268;
  code *pcStack_260;
  SPIRFunction *local_250;
  string local_248;
  string local_228;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *local_208;
  undefined1 local_200 [8];
  CompilerMSL *pCStack_1f8;
  undefined1 local_1f0 [8];
  undefined1 local_1e8 [16];
  undefined8 local_1d8;
  uint32_t local_1d0;
  uint32_t uStack_1cc;
  SmallVector<unsigned_int,_8UL> local_1c8;
  SmallVector<bool,_8UL> local_190;
  _func_int **local_170;
  StorageClass local_168;
  undefined1 local_160 [56];
  SmallVector<unsigned_int,_8UL> local_128;
  TypeID local_f0;
  Dim DStack_ec;
  undefined4 uStack_e8;
  uint32_t uStack_e4;
  ImageFormat local_e0;
  AccessQualifier AStack_dc;
  TypeID TStack_d8;
  TypeID TStack_d4;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  _Stack_d0;
  string *local_98;
  string local_90;
  string local_70;
  string local_50;
  
  local_98 = ib_var_ref;
  local_250 = Variant::get<spirv_cross::SPIRFunction>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr +
                         (this->super_CompilerGLSL).super_Compiler.ir.default_entry_point.id);
  local_28c = BuiltInMax;
  bVar5 = Compiler::is_member_builtin((Compiler *)this,var_type,mbr_idx,&local_28c);
  local_288 = var_type;
  bVar6 = Compiler::has_member_decoration
                    ((Compiler *)this,(TypeID)(var_type->super_IVariant).self.id,mbr_idx,
                     DecorationFlat);
  local_2a7 = true;
  local_29d = true;
  if (!bVar6) {
    local_29d = Compiler::has_decoration
                          ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationFlat);
  }
  bVar6 = Compiler::has_member_decoration
                    ((Compiler *)this,(TypeID)(local_288->super_IVariant).self.id,mbr_idx,
                     DecorationNoPerspective);
  if (!bVar6) {
    local_2a7 = Compiler::has_decoration
                          ((Compiler *)this,(ID)(var->super_IVariant).self.id,
                           DecorationNoPerspective);
  }
  bVar6 = Compiler::has_member_decoration
                    ((Compiler *)this,(TypeID)(local_288->super_IVariant).self.id,mbr_idx,Centroid);
  local_2a5 = true;
  bVar7 = true;
  if (!bVar6) {
    bVar7 = Compiler::has_decoration((Compiler *)this,(ID)(var->super_IVariant).self.id,Centroid);
  }
  bVar6 = Compiler::has_member_decoration
                    ((Compiler *)this,(TypeID)(local_288->super_IVariant).self.id,mbr_idx,
                     DecorationSample);
  if (!bVar6) {
    local_2a5 = Compiler::has_decoration
                          ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationSample);
  }
  pSVar13 = local_288;
  local_208 = &ib_type->member_types;
  uVar14 = (ib_type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
           buffer_size;
  local_29c = ensure_correct_builtin_type
                        (this,(local_288->member_types).
                              super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
                              [mbr_idx].id,local_28c);
  (pSVar13->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
  [mbr_idx].id = local_29c;
  uVar8 = local_29c;
  local_280 = (CompilerMSL *)var;
  if (storage == Input) {
    local_200._0_4_ = (var->super_IVariant).self.id;
    sVar10 = ::std::
             _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
             ::count(&(this->pull_model_inputs)._M_h,(key_type_conflict *)local_200);
    if (sVar10 != 0) {
      uVar8 = build_msl_interpolant_type(this,local_29c,local_2a7);
    }
  }
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::reserve
            (local_208,
             (ib_type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
             buffer_size + 1);
  sVar2 = (ib_type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
          buffer_size;
  (ib_type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr[sVar2].
  id = uVar8;
  (ib_type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size
       = sVar2 + 1;
  ts_2 = (char (*) [2])(ulong)mbr_idx;
  append_member_name(&local_50,this,mbr_name_qual,local_288,mbr_idx);
  pCVar20 = (CompilerMSL *)0x3ebb0d;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"m","");
  ensure_valid_name(&local_90,pCVar20,&local_50,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  uVar8 = (uint32_t)uVar14;
  Compiler::set_member_name
            ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,uVar8,&local_90);
  pcVar3 = (local_98->_M_dataplus)._M_p;
  local_200 = (undefined1  [8])local_1f0;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_200,pcVar3,pcVar3 + local_98->_M_string_length);
  ::std::__cxx11::string::append(local_200);
  plVar11 = (long *)::std::__cxx11::string::_M_append(local_200,(ulong)local_90._M_dataplus._M_p);
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  psVar19 = (size_type *)(plVar11 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar19) {
    local_228.field_2._M_allocated_capacity = *psVar19;
    local_228.field_2._8_8_ = plVar11[3];
  }
  else {
    local_228.field_2._M_allocated_capacity = *psVar19;
    local_228._M_dataplus._M_p = (pointer)*plVar11;
  }
  local_228._M_string_length = plVar11[1];
  *plVar11 = (long)psVar19;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  if (local_200 != (undefined1  [8])local_1f0) {
    operator_delete((void *)local_200);
  }
  if (storage == Input) {
    local_200._0_4_ =
         *(undefined4 *)
          &(local_280->super_CompilerGLSL).super_Compiler.ir.pool_group._M_t.
           super___uniq_ptr_impl<spirv_cross::ObjectPoolGroup,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
           ._M_t.
           super__Tuple_impl<0UL,_spirv_cross::ObjectPoolGroup_*,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
           .super__Head_base<0UL,_spirv_cross::ObjectPoolGroup_*,_false>._M_head_impl;
    sVar10 = ::std::
             _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
             ::count(&(this->pull_model_inputs)._M_h,(key_type_conflict *)local_200);
    if (sVar10 != 0) {
      if (local_2a5 == true && bVar7 == false) {
        CompilerGLSL::to_expression_abi_cxx11_
                  (&local_248,&this->super_CompilerGLSL,this->builtin_sample_id_id,true);
        join<char_const(&)[24],std::__cxx11::string,char_const(&)[2]>
                  ((string *)local_200,(spirv_cross *)".interpolate_at_sample(",
                   (char (*) [24])&local_248,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x415df5,
                   ts_2);
        ::std::__cxx11::string::_M_append((char *)&local_228,(ulong)local_200);
        if (local_200 != (undefined1  [8])local_1f0) {
          operator_delete((void *)local_200);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_dataplus._M_p != &local_248.field_2) {
          operator_delete(local_248._M_dataplus._M_p);
        }
      }
      else {
        ::std::__cxx11::string::append((char *)&local_228);
      }
    }
  }
  pcVar3 = (var_chain_qual->_M_dataplus)._M_p;
  local_200 = (undefined1  [8])local_1f0;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_200,pcVar3,pcVar3 + var_chain_qual->_M_string_length);
  ::std::__cxx11::string::append(local_200);
  CompilerGLSL::to_member_name_abi_cxx11_
            ((string *)&local_278,&this->super_CompilerGLSL,local_288,mbr_idx);
  pcVar1 = (pCStack_1f8->super_CompilerGLSL).super_Compiler.ir.ids.stack_storage.aligned_char +
           local_278._8_8_ + -0x40;
  auVar21 = (undefined1  [8])(_func_int **)0xf;
  if (local_200 != (undefined1  [8])local_1f0) {
    auVar21 = local_1f0;
  }
  if ((ulong)auVar21 < pcVar1) {
    pp_Var22 = (_func_int **)0xf;
    if ((_func_int ***)local_278._M_unused._0_8_ != &local_268) {
      pp_Var22 = local_268;
    }
    if (pp_Var22 < pcVar1) goto LAB_0029012b;
    puVar12 = (undefined8 *)
              ::std::__cxx11::string::replace((ulong)&local_278,0,(char *)0x0,(ulong)local_200);
  }
  else {
LAB_0029012b:
    puVar12 = (undefined8 *)
              ::std::__cxx11::string::_M_append(local_200,local_278._M_unused._M_member_pointer);
  }
  local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
  psVar19 = puVar12 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar12 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar19) {
    local_248.field_2._M_allocated_capacity = *psVar19;
    local_248.field_2._8_8_ = puVar12[3];
  }
  else {
    local_248.field_2._M_allocated_capacity = *psVar19;
    local_248._M_dataplus._M_p = (pointer)*puVar12;
  }
  local_248._M_string_length = puVar12[1];
  *puVar12 = psVar19;
  puVar12[1] = 0;
  *(undefined1 *)psVar19 = 0;
  if ((_func_int ***)local_278._M_unused._0_8_ != &local_268) {
    operator_delete(local_278._M_unused._M_object);
  }
  if (local_200 != (undefined1  [8])local_1f0) {
    operator_delete((void *)local_200);
  }
  if ((bVar5) && (meta->strip_array == false)) {
    bVar23 = 1;
    Compiler::set_member_qualified_name
              ((Compiler *)this,(local_288->super_IVariant).self.id,mbr_idx,&local_228);
  }
  else {
    bVar23 = 1;
    local_1d8 = (SmallVector<unsigned_int,_8UL> *)CONCAT44(local_1d8._4_4_,(BaseType)local_1d8);
    if ((meta->strip_array == false) &&
       (local_1d8 = (SmallVector<unsigned_int,_8UL> *)CONCAT44(local_1d8._4_4_,(BaseType)local_1d8),
       meta->allow_local_declaration == true)) {
      if (storage == Output) {
        local_200 = (undefined1  [8])this;
        pCStack_1f8 = (CompilerMSL *)local_1e8;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&pCStack_1f8,local_228._M_dataplus._M_p,
                   local_228._M_dataplus._M_p + local_228._M_string_length);
        local_1d8 = &local_1c8;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1d8,local_248._M_dataplus._M_p,
                   local_248._M_dataplus._M_p + local_248._M_string_length);
        local_268 = (_func_int **)0x0;
        pcStack_260 = (code *)0x0;
        local_278._M_unused._M_object = (void *)0x0;
        local_278._8_8_ = 0;
        local_278._M_unused._M_object = operator_new(0x48);
        *(undefined1 (*) [8])local_278._M_unused._0_8_ = local_200;
        *(tuple<spirv_cross::ObjectPoolGroup_*,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
          **)((long)local_278._M_unused._0_8_ + 8) =
             (tuple<spirv_cross::ObjectPoolGroup_*,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
              *)((long)local_278._M_unused._0_8_ + 0x18);
        if (pCStack_1f8 == (CompilerMSL *)local_1e8) {
          ((tuple<spirv_cross::ObjectPoolGroup_*,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
            *)((long)local_278._M_unused._0_8_ + 0x18))->
          super__Tuple_impl<0UL,_spirv_cross::ObjectPoolGroup_*,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
               = (_Tuple_impl<0UL,_spirv_cross::ObjectPoolGroup_*,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
                  )local_1e8._0_8_;
          *(_func_int ***)((long)local_278._M_unused._0_8_ + 0x20) =
               (_func_int **)CONCAT44(local_1e8._12_4_,local_1e8._8_4_);
        }
        else {
          *(CompilerMSL **)((long)local_278._M_unused._0_8_ + 8) = pCStack_1f8;
          ((tuple<spirv_cross::ObjectPoolGroup_*,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
            *)((long)local_278._M_unused._0_8_ + 0x18))->
          super__Tuple_impl<0UL,_spirv_cross::ObjectPoolGroup_*,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
               = (_Tuple_impl<0UL,_spirv_cross::ObjectPoolGroup_*,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
                  )local_1e8._0_8_;
        }
        *(undefined1 (*) [8])((long)local_278._M_unused._0_8_ + 0x10) = local_1f0;
        local_1f0 = (undefined1  [8])0x0;
        local_1e8._0_8_ = local_1e8._0_8_ & 0xffffffffffffff00;
        *(_func_int ****)((long)local_278._M_unused._0_8_ + 0x28) =
             (_func_int ***)((long)local_278._M_unused._0_8_ + 0x38);
        if (local_1d8 == &local_1c8) {
          *(_func_int ***)((long)local_278._M_unused._0_8_ + 0x38) =
               (_func_int **)
               CONCAT71(local_1c8.super_VectorView<unsigned_int>.ptr._1_7_,
                        local_1c8.super_VectorView<unsigned_int>.ptr._0_1_);
          *(size_t *)((long)local_278._M_unused._0_8_ + 0x40) =
               local_1c8.super_VectorView<unsigned_int>.buffer_size;
        }
        else {
          *(SmallVector<unsigned_int,_8UL> **)((long)local_278._M_unused._0_8_ + 0x28) = local_1d8;
          *(_func_int ***)((long)local_278._M_unused._0_8_ + 0x38) =
               (_func_int **)
               CONCAT71(local_1c8.super_VectorView<unsigned_int>.ptr._1_7_,
                        local_1c8.super_VectorView<unsigned_int>.ptr._0_1_);
        }
        *(_func_int ***)((long)local_278._M_unused._0_8_ + 0x30) =
             (_func_int **)CONCAT44(uStack_1cc,local_1d0);
        local_1d0 = 0;
        uStack_1cc = 0;
        local_1c8.super_VectorView<unsigned_int>.ptr._0_1_ = 0;
        pcStack_260 = ::std::
                      _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_msl.cpp:3243:41)>
                      ::_M_invoke;
        local_268 = (_func_int **)
                    ::std::
                    _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_msl.cpp:3243:41)>
                    ::_M_manager;
        pCStack_1f8 = (CompilerMSL *)local_1e8;
        local_1d8 = &local_1c8;
        SmallVector<std::function<void_()>,_0UL>::push_back
                  (&local_250->fixup_hooks_out,(function<void_()> *)&local_278);
        if (local_268 != (_func_int **)0x0) {
          (*(code *)local_268)(&local_278,&local_278,3);
        }
        if (local_1d8 != &local_1c8) {
          operator_delete(local_1d8);
        }
        if (pCStack_1f8 != (CompilerMSL *)local_1e8) {
          operator_delete(pCStack_1f8);
        }
        bVar23 = 0;
      }
      else {
        local_1d8 = (SmallVector<unsigned_int,_8UL> *)CONCAT44(local_1d8._4_4_,(BaseType)local_1d8);
        if (storage == Input) {
          local_200 = (undefined1  [8])this;
          pCStack_1f8 = (CompilerMSL *)local_1e8;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&pCStack_1f8,local_248._M_dataplus._M_p,
                     local_248._M_dataplus._M_p + local_248._M_string_length);
          local_1d8 = &local_1c8;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1d8,local_228._M_dataplus._M_p,
                     local_228._M_dataplus._M_p + local_228._M_string_length);
          local_268 = (_func_int **)0x0;
          pcStack_260 = (code *)0x0;
          local_278._M_unused._M_object = (void *)0x0;
          local_278._8_8_ = 0;
          local_278._M_unused._M_object = operator_new(0x48);
          *(undefined1 (*) [8])local_278._M_unused._0_8_ = local_200;
          *(tuple<spirv_cross::ObjectPoolGroup_*,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
            **)((long)local_278._M_unused._0_8_ + 8) =
               (tuple<spirv_cross::ObjectPoolGroup_*,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
                *)((long)local_278._M_unused._0_8_ + 0x18);
          if (pCStack_1f8 == (CompilerMSL *)local_1e8) {
            ((tuple<spirv_cross::ObjectPoolGroup_*,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
              *)((long)local_278._M_unused._0_8_ + 0x18))->
            super__Tuple_impl<0UL,_spirv_cross::ObjectPoolGroup_*,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
                 = (_Tuple_impl<0UL,_spirv_cross::ObjectPoolGroup_*,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
                    )local_1e8._0_8_;
            *(_func_int ***)((long)local_278._M_unused._0_8_ + 0x20) =
                 (_func_int **)CONCAT44(local_1e8._12_4_,local_1e8._8_4_);
          }
          else {
            *(CompilerMSL **)((long)local_278._M_unused._0_8_ + 8) = pCStack_1f8;
            ((tuple<spirv_cross::ObjectPoolGroup_*,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
              *)((long)local_278._M_unused._0_8_ + 0x18))->
            super__Tuple_impl<0UL,_spirv_cross::ObjectPoolGroup_*,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
                 = (_Tuple_impl<0UL,_spirv_cross::ObjectPoolGroup_*,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
                    )local_1e8._0_8_;
          }
          *(undefined1 (*) [8])((long)local_278._M_unused._0_8_ + 0x10) = local_1f0;
          local_1f0 = (undefined1  [8])0x0;
          local_1e8._0_8_ = local_1e8._0_8_ & 0xffffffffffffff00;
          *(_func_int ****)((long)local_278._M_unused._0_8_ + 0x28) =
               (_func_int ***)((long)local_278._M_unused._0_8_ + 0x38);
          if (local_1d8 == &local_1c8) {
            *(_func_int ***)((long)local_278._M_unused._0_8_ + 0x38) =
                 (_func_int **)
                 CONCAT71(local_1c8.super_VectorView<unsigned_int>.ptr._1_7_,
                          local_1c8.super_VectorView<unsigned_int>.ptr._0_1_);
            *(size_t *)((long)local_278._M_unused._0_8_ + 0x40) =
                 local_1c8.super_VectorView<unsigned_int>.buffer_size;
          }
          else {
            *(SmallVector<unsigned_int,_8UL> **)((long)local_278._M_unused._0_8_ + 0x28) = local_1d8
            ;
            *(_func_int ***)((long)local_278._M_unused._0_8_ + 0x38) =
                 (_func_int **)
                 CONCAT71(local_1c8.super_VectorView<unsigned_int>.ptr._1_7_,
                          local_1c8.super_VectorView<unsigned_int>.ptr._0_1_);
          }
          *(_func_int ***)((long)local_278._M_unused._0_8_ + 0x30) =
               (_func_int **)CONCAT44(uStack_1cc,local_1d0);
          local_1d0 = 0;
          uStack_1cc = 0;
          local_1c8.super_VectorView<unsigned_int>.ptr._0_1_ = 0;
          pcStack_260 = ::std::
                        _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_msl.cpp:3236:40)>
                        ::_M_invoke;
          local_268 = (_func_int **)
                      ::std::
                      _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_msl.cpp:3236:40)>
                      ::_M_manager;
          pCStack_1f8 = (CompilerMSL *)local_1e8;
          local_1d8 = &local_1c8;
          SmallVector<std::function<void_()>,_0UL>::push_back
                    (&local_250->fixup_hooks_in,(function<void_()> *)&local_278);
          if (local_268 != (_func_int **)0x0) {
            (*(code *)local_268)(&local_278,&local_278,3);
          }
          if (local_1d8 != &local_1c8) {
            operator_delete(local_1d8);
          }
          if (pCStack_1f8 != (CompilerMSL *)local_1e8) {
            operator_delete(pCStack_1f8);
          }
        }
      }
    }
  }
  if (*location == 0xffffffff || bVar5) {
    bVar6 = Compiler::has_member_decoration
                      ((Compiler *)this,(TypeID)(local_288->super_IVariant).self.id,mbr_idx,
                       DecorationLocation);
    uVar14 = uVar14 & 0xffffffff;
    if (bVar6) {
      uVar9 = Compiler::get_member_decoration
                        ((Compiler *)this,(TypeID)(local_288->super_IVariant).self.id,mbr_idx,
                         DecorationLocation);
      *location = uVar9;
      uVar9 = Compiler::get_member_decoration
                        ((Compiler *)this,(TypeID)(local_288->super_IVariant).self.id,mbr_idx,
                         Component);
      if (storage == Input) {
        local_29c = ensure_correct_input_type(this,local_29c,*location,uVar9,0,meta->strip_array);
        (local_288->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
        [mbr_idx].id = local_29c;
        local_200._0_4_ =
             *(undefined4 *)
              &(local_280->super_CompilerGLSL).super_Compiler.ir.pool_group._M_t.
               super___uniq_ptr_impl<spirv_cross::ObjectPoolGroup,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
               ._M_t.
               super__Tuple_impl<0UL,_spirv_cross::ObjectPoolGroup_*,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
               .super__Head_base<0UL,_spirv_cross::ObjectPoolGroup_*,_false>._M_head_impl;
        sVar10 = ::std::
                 _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 ::count(&(this->pull_model_inputs)._M_h,(key_type_conflict *)local_200);
        uVar9 = local_29c;
        if (sVar10 != 0) {
          uVar9 = build_msl_interpolant_type(this,local_29c,local_2a7);
        }
        (local_208->super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>).ptr[uVar14].id =
             uVar9;
      }
      Compiler::set_member_decoration
                ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,uVar8,DecorationLocation
                 ,*location);
      uVar9 = *location;
      pSVar13 = Variant::get<spirv_cross::SPIRType>
                          ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                           super_VectorView<spirv_cross::Variant>.ptr + local_29c);
      mark_location_as_used_by_shader(this,uVar9,pSVar13,storage,false);
      pSVar13 = Variant::get<spirv_cross::SPIRType>
                          ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                           super_VectorView<spirv_cross::Variant>.ptr + local_29c);
      uVar9 = CompilerGLSL::type_to_location_count(&this->super_CompilerGLSL,pSVar13);
      goto LAB_002904a0;
    }
    bVar6 = Compiler::has_decoration
                      ((Compiler *)this,
                       (ID)*(uint32_t *)
                            &(local_280->super_CompilerGLSL).super_Compiler.ir.pool_group._M_t.
                             super___uniq_ptr_impl<spirv_cross::ObjectPoolGroup,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_spirv_cross::ObjectPoolGroup_*,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
                             .super__Head_base<0UL,_spirv_cross::ObjectPoolGroup_*,_false>.
                             _M_head_impl,DecorationLocation);
    if (bVar6) {
      uVar9 = CompilerGLSL::get_accumulated_member_location
                        (&this->super_CompilerGLSL,(SPIRVariable *)local_280,mbr_idx,
                         meta->strip_array);
      *location = uVar9;
      if (storage == Input) {
        local_29c = ensure_correct_input_type(this,local_29c,uVar9,0,0,meta->strip_array);
        (local_288->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
        [mbr_idx].id = local_29c;
        local_200._0_4_ =
             *(undefined4 *)
              &(local_280->super_CompilerGLSL).super_Compiler.ir.pool_group._M_t.
               super___uniq_ptr_impl<spirv_cross::ObjectPoolGroup,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
               ._M_t.
               super__Tuple_impl<0UL,_spirv_cross::ObjectPoolGroup_*,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
               .super__Head_base<0UL,_spirv_cross::ObjectPoolGroup_*,_false>._M_head_impl;
        sVar10 = ::std::
                 _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 ::count(&(this->pull_model_inputs)._M_h,(key_type_conflict *)local_200);
        uVar9 = local_29c;
        if (sVar10 != 0) {
          uVar9 = build_msl_interpolant_type(this,local_29c,local_2a7);
        }
        (local_208->super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>).ptr[uVar14].id =
             uVar9;
      }
      Compiler::set_member_decoration
                ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,uVar8,DecorationLocation
                 ,*location);
      uVar9 = *location;
      pSVar13 = Variant::get<spirv_cross::SPIRType>
                          ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                           super_VectorView<spirv_cross::Variant>.ptr + local_29c);
      mark_location_as_used_by_shader(this,uVar9,pSVar13,storage,false);
      pSVar13 = Variant::get<spirv_cross::SPIRType>
                          ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                           super_VectorView<spirv_cross::Variant>.ptr + local_29c);
      uVar9 = CompilerGLSL::type_to_location_count(&this->super_CompilerGLSL,pSVar13);
      goto LAB_002904a0;
    }
    if (bVar5) {
      bVar6 = Compiler::is_tessellation_shader((Compiler *)this);
      if (bVar6 && storage == Input) {
        local_200._0_4_ = local_28c;
        sVar17 = ::std::
                 _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::count(&(this->inputs_by_builtin)._M_h,(key_type_conflict *)local_200);
        if (sVar17 != 0) {
          local_200._0_4_ = local_28c;
          pmVar18 = ::std::__detail::
                    _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                  *)&this->inputs_by_builtin,(key_type *)local_200);
          uVar9 = pmVar18->location;
          *location = uVar9;
          Compiler::set_member_decoration
                    ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,uVar8,
                     DecorationLocation,uVar9);
          uVar9 = *location;
          pSVar13 = Variant::get<spirv_cross::SPIRType>
                              ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                               super_VectorView<spirv_cross::Variant>.ptr + local_29c);
          mark_location_as_used_by_shader(this,uVar9,pSVar13,Input,false);
          pSVar13 = Variant::get<spirv_cross::SPIRType>
                              ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                               super_VectorView<spirv_cross::Variant>.ptr + local_29c);
          uVar9 = CompilerGLSL::type_to_location_count(&this->super_CompilerGLSL,pSVar13);
          goto LAB_002904a0;
        }
      }
    }
    if (((bVar5) && (storage == Output)) && (this->capture_output_to_buffer != false)) {
      local_200._0_4_ = local_28c;
      sVar17 = ::std::
               _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               ::count(&(this->outputs_by_builtin)._M_h,(key_type_conflict *)local_200);
      if (sVar17 != 0) {
        local_200._0_4_ = local_28c;
        pmVar18 = ::std::__detail::
                  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&this->outputs_by_builtin,(key_type *)local_200);
        uVar9 = pmVar18->location;
        *location = uVar9;
        Compiler::set_member_decoration
                  ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,uVar8,
                   DecorationLocation,uVar9);
        uVar9 = *location;
        pSVar13 = Variant::get<spirv_cross::SPIRType>
                            ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                             super_VectorView<spirv_cross::Variant>.ptr + local_29c);
        mark_location_as_used_by_shader(this,uVar9,pSVar13,Output,false);
        pSVar13 = Variant::get<spirv_cross::SPIRType>
                            ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                             super_VectorView<spirv_cross::Variant>.ptr + local_29c);
        uVar9 = CompilerGLSL::type_to_location_count(&this->super_CompilerGLSL,pSVar13);
        goto LAB_002904a0;
      }
    }
  }
  else {
    Compiler::set_member_decoration
              ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,uVar8,DecorationLocation,
               *location);
    uVar9 = *location;
    pSVar13 = Variant::get<spirv_cross::SPIRType>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr + local_29c);
    mark_location_as_used_by_shader(this,uVar9,pSVar13,storage,false);
    pSVar13 = Variant::get<spirv_cross::SPIRType>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr + local_29c);
    uVar9 = CompilerGLSL::type_to_location_count(&this->super_CompilerGLSL,pSVar13);
LAB_002904a0:
    *location = *location + uVar9;
  }
  bVar6 = Compiler::has_member_decoration
                    ((Compiler *)this,(TypeID)(local_288->super_IVariant).self.id,mbr_idx,Component)
  ;
  if (bVar6) {
    uVar9 = Compiler::get_member_decoration
                      ((Compiler *)this,(TypeID)(local_288->super_IVariant).self.id,mbr_idx,
                       Component);
    Compiler::set_member_decoration
              ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,uVar8,Component,uVar9);
  }
  if (bVar5) {
    Compiler::set_member_decoration
              ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,uVar8,BuiltIn,local_28c);
    if ((storage == Output) && (local_28c == BuiltInPosition)) {
      ::std::__cxx11::string::_M_assign((string *)&this->qual_pos_var_name);
    }
  }
  pCVar20 = local_280;
  if (((bool)(bVar23 & *(int *)&(local_280->super_CompilerGLSL).super_Compiler.ir.spirv.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start == 3)) &&
     (uVar14 = (ulong)*(uint *)((long)&(local_280->super_CompilerGLSL).super_Compiler.ir.spirv.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data + 8), uVar14 != 0)) {
    if ((uVar14 < (this->super_CompilerGLSL).super_Compiler.ir.ids.
                  super_VectorView<spirv_cross::Variant>.buffer_size) &&
       (pVVar4 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
                 super_VectorView<spirv_cross::Variant>.ptr, pVVar4[uVar14].type == TypeConstant)) {
      pSVar15 = Variant::get<spirv_cross::SPIRConstant>(pVVar4 + uVar14);
    }
    else {
      pSVar15 = (SPIRConstant *)0x0;
    }
    if (pSVar15 != (SPIRConstant *)0x0) {
      local_250 = (SPIRFunction *)&local_250->fixup_hooks_in;
      if (meta->strip_array == true) {
        local_200 = (undefined1  [8])pCVar20;
        local_1f0._0_4_ = mbr_idx;
        pCStack_1f8 = this;
        SPIRType::SPIRType((SPIRType *)local_1e8,ib_type);
        local_268 = (_func_int **)0x0;
        pcStack_260 = (code *)0x0;
        local_278._M_unused._M_object = (void *)0x0;
        local_278._8_8_ = 0;
        ppp_Var16 = (_func_int ***)operator_new(0x168);
        *(undefined4 *)(ppp_Var16 + 2) = local_1f0._0_4_;
        *ppp_Var16 = (_func_int **)local_200;
        ppp_Var16[1] = (_func_int **)pCStack_1f8;
        ppp_Var16[3] = (_func_int **)&PTR__IVariant_0050af68;
        *(undefined4 *)(ppp_Var16 + 4) = local_1e8._8_4_;
        ppp_Var16[3] = (_func_int **)&PTR__SPIRType_0050af18;
        *(ulong *)((long)ppp_Var16 + 0x24) = CONCAT44((BaseType)local_1d8,local_1e8._12_4_);
        *(ulong *)((long)ppp_Var16 + 0x2c) = CONCAT44(local_1d0,local_1d8._4_4_);
        *(uint32_t *)((long)ppp_Var16 + 0x34) = uStack_1cc;
        ppp_Var16[7] = (_func_int **)0x0;
        ppp_Var16[8] = (_func_int **)0x0;
        ppp_Var16[7] = (_func_int **)(ppp_Var16 + 10);
        ppp_Var16[9] = (_func_int **)0x8;
        SmallVector<unsigned_int,_8UL>::operator=
                  ((SmallVector<unsigned_int,_8UL> *)(ppp_Var16 + 7),&local_1c8);
        ppp_Var16[0xe] = (_func_int **)0x0;
        ppp_Var16[0xf] = (_func_int **)0x0;
        ppp_Var16[0xe] = (_func_int **)(ppp_Var16 + 0x11);
        ppp_Var16[0x10] = (_func_int **)0x8;
        SmallVector<bool,_8UL>::operator=((SmallVector<bool,_8UL> *)(ppp_Var16 + 0xe),&local_190);
        ppp_Var16[0x12] = local_170;
        *(StorageClass *)(ppp_Var16 + 0x13) = local_168;
        ppp_Var16[0x14] = (_func_int **)0x0;
        ppp_Var16[0x15] = (_func_int **)0x0;
        ppp_Var16[0x14] = (_func_int **)(ppp_Var16 + 0x17);
        ppp_Var16[0x16] = (_func_int **)0x8;
        SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::operator=
                  ((SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)
                   (ppp_Var16 + 0x14),
                   (SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)local_160);
        ppp_Var16[0x1b] = (_func_int **)0x0;
        ppp_Var16[0x1c] = (_func_int **)0x0;
        ppp_Var16[0x1b] = (_func_int **)(ppp_Var16 + 0x1e);
        ppp_Var16[0x1d] = (_func_int **)0x8;
        SmallVector<unsigned_int,_8UL>::operator=
                  ((SmallVector<unsigned_int,_8UL> *)(ppp_Var16 + 0x1b),&local_128);
        *(uint32_t *)(ppp_Var16 + 0x22) = local_f0.id;
        *(Dim *)((long)ppp_Var16 + 0x114) = DStack_ec;
        *(undefined4 *)(ppp_Var16 + 0x23) = uStack_e8;
        *(uint32_t *)((long)ppp_Var16 + 0x11c) = uStack_e4;
        *(ImageFormat *)(ppp_Var16 + 0x24) = local_e0;
        *(AccessQualifier *)((long)ppp_Var16 + 0x124) = AStack_dc;
        *(uint32_t *)(ppp_Var16 + 0x25) = TStack_d8.id;
        *(uint32_t *)((long)ppp_Var16 + 300) = TStack_d4.id;
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                      *)(ppp_Var16 + 0x26),&_Stack_d0,&_Stack_d0);
        pcStack_260 = ::std::
                      _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_msl.cpp:3333:40)>
                      ::_M_invoke;
        local_268 = (_func_int **)
                    ::std::
                    _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_msl.cpp:3333:40)>
                    ::_M_manager;
        local_278._M_unused._0_8_ = ppp_Var16;
        SmallVector<std::function<void_()>,_0UL>::push_back
                  ((SmallVector<std::function<void_()>,_0UL> *)local_250,
                   (function<void_()> *)&local_278);
        if (local_268 != (_func_int **)0x0) {
          (*(code *)local_268)(&local_278,&local_278,3);
        }
        local_1e8._0_8_ = &PTR__SPIRType_0050af18;
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::~_Hashtable(&_Stack_d0);
        local_128.super_VectorView<unsigned_int>.buffer_size = 0;
        if ((AlignedBuffer<unsigned_int,_8UL> *)local_128.super_VectorView<unsigned_int>.ptr !=
            &local_128.stack_storage) {
          free(local_128.super_VectorView<unsigned_int>.ptr);
        }
        pCVar20 = local_280;
        local_160._8_8_ = 0;
        if ((TypedID<(spirv_cross::Types)1> *)local_160._0_8_ !=
            (TypedID<(spirv_cross::Types)1> *)(local_160 + 0x18)) {
          free((void *)local_160._0_8_);
        }
        local_190.super_VectorView<bool>.buffer_size = 0;
        if ((AlignedBuffer<bool,_8UL> *)local_190.super_VectorView<bool>.ptr !=
            &local_190.stack_storage) {
          free(local_190.super_VectorView<bool>.ptr);
        }
        local_1c8.super_VectorView<unsigned_int>.buffer_size = 0;
        if ((AlignedBuffer<unsigned_int,_8UL> *)
            CONCAT71(local_1c8.super_VectorView<unsigned_int>.ptr._1_7_,
                     local_1c8.super_VectorView<unsigned_int>.ptr._0_1_) != &local_1c8.stack_storage
           ) {
          free((undefined1 *)
               CONCAT71(local_1c8.super_VectorView<unsigned_int>.ptr._1_7_,
                        local_1c8.super_VectorView<unsigned_int>.ptr._0_1_));
        }
      }
      else {
        local_200 = (undefined1  [8])this;
        pCStack_1f8 = (CompilerMSL *)local_1e8;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&pCStack_1f8,local_228._M_dataplus._M_p,
                   local_228._M_dataplus._M_p + local_228._M_string_length);
        local_1d8._0_4_ = (BaseType)pSVar15;
        local_1d8._4_4_ = (uint32_t)((ulong)pSVar15 >> 0x20);
        local_1d0 = mbr_idx;
        local_278._M_unused._M_object = (void *)0x0;
        local_278._8_8_ = 0;
        local_268 = (_func_int **)0x0;
        pcStack_260 = (code *)0x0;
        local_278._M_unused._M_object = operator_new(0x38);
        *(undefined1 (*) [8])local_278._M_unused._0_8_ = local_200;
        *(_func_int ****)((long)local_278._M_unused._0_8_ + 8) =
             (_func_int ***)((long)local_278._M_unused._0_8_ + 0x18);
        if (pCStack_1f8 == (CompilerMSL *)local_1e8) {
          *(_func_int ***)((long)local_278._M_unused._0_8_ + 0x18) = (_func_int **)local_1e8._0_8_;
          *(_func_int ***)((long)local_278._M_unused._0_8_ + 0x20) =
               (_func_int **)CONCAT44(local_1e8._12_4_,local_1e8._8_4_);
        }
        else {
          *(CompilerMSL **)((long)local_278._M_unused._0_8_ + 8) = pCStack_1f8;
          *(undefined8 *)((long)local_278._M_unused._0_8_ + 0x18) = local_1e8._0_8_;
        }
        *(undefined1 (*) [8])((long)local_278._M_unused._0_8_ + 0x10) = local_1f0;
        local_1f0 = (undefined1  [8])0x0;
        local_1e8._0_8_ = local_1e8._0_8_ & 0xffffffffffffff00;
        *(uint32_t *)((long)local_278._M_unused._0_8_ + 0x30) = local_1d0;
        *(_func_int ***)((long)local_278._M_unused._0_8_ + 0x28) =
             (_func_int **)CONCAT44(local_1d8._4_4_,(BaseType)local_1d8);
        pcStack_260 = ::std::
                      _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_msl.cpp:3347:40)>
                      ::_M_invoke;
        local_268 = (_func_int **)
                    ::std::
                    _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_msl.cpp:3347:40)>
                    ::_M_manager;
        pCStack_1f8 = (CompilerMSL *)local_1e8;
        SmallVector<std::function<void_()>,_0UL>::push_back
                  ((SmallVector<std::function<void_()>,_0UL> *)local_250,
                   (function<void_()> *)&local_278);
        if (local_268 != (_func_int **)0x0) {
          (*(code *)local_268)(&local_278,&local_278,3);
        }
        if (pCStack_1f8 != (CompilerMSL *)local_1e8) {
          operator_delete(pCStack_1f8);
        }
      }
    }
  }
  if (storage == Input) {
    local_200._0_4_ =
         *(undefined4 *)
          &(pCVar20->super_CompilerGLSL).super_Compiler.ir.pool_group._M_t.
           super___uniq_ptr_impl<spirv_cross::ObjectPoolGroup,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
           ._M_t.
           super__Tuple_impl<0UL,_spirv_cross::ObjectPoolGroup_*,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
           .super__Head_base<0UL,_spirv_cross::ObjectPoolGroup_*,_false>._M_head_impl;
    sVar10 = ::std::
             _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
             ::count(&(this->pull_model_inputs)._M_h,(key_type_conflict *)local_200);
    if (sVar10 != 0) goto LAB_00290d83;
  }
  if (local_29d != false) {
    Compiler::set_member_decoration
              ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,uVar8,DecorationFlat,0);
  }
  if (local_2a7 != false) {
    Compiler::set_member_decoration
              ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,uVar8,
               DecorationNoPerspective,0);
  }
  if (bVar7 != false) {
    Compiler::set_member_decoration
              ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,uVar8,Centroid,0);
  }
  if (local_2a5 != false) {
    Compiler::set_member_decoration
              ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,uVar8,DecorationSample,0);
  }
LAB_00290d83:
  Compiler::set_extended_member_decoration
            ((Compiler *)this,(ib_type->super_IVariant).self.id,uVar8,
             SPIRVCrossDecorationInterfaceOrigID,
             *(uint32_t *)
              &(pCVar20->super_CompilerGLSL).super_Compiler.ir.pool_group._M_t.
               super___uniq_ptr_impl<spirv_cross::ObjectPoolGroup,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
               ._M_t.
               super__Tuple_impl<0UL,_spirv_cross::ObjectPoolGroup_*,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
               .super__Head_base<0UL,_spirv_cross::ObjectPoolGroup_*,_false>._M_head_impl);
  Compiler::set_extended_member_decoration
            ((Compiler *)this,(ib_type->super_IVariant).self.id,uVar8,
             SPIRVCrossDecorationInterfaceMemberIndex,*var_mbr_idx);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  return;
}

Assistant:

void CompilerMSL::add_plain_member_variable_to_interface_block(StorageClass storage,
                                                               const string &ib_var_ref, SPIRType &ib_type,
                                                               SPIRVariable &var, SPIRType &var_type,
                                                               uint32_t mbr_idx, InterfaceBlockMeta &meta,
                                                               const string &mbr_name_qual,
                                                               const string &var_chain_qual,
                                                               uint32_t &location, uint32_t &var_mbr_idx)
{
	auto &entry_func = get<SPIRFunction>(ir.default_entry_point);

	BuiltIn builtin = BuiltInMax;
	bool is_builtin = is_member_builtin(var_type, mbr_idx, &builtin);
	bool is_flat =
	    has_member_decoration(var_type.self, mbr_idx, DecorationFlat) || has_decoration(var.self, DecorationFlat);
	bool is_noperspective = has_member_decoration(var_type.self, mbr_idx, DecorationNoPerspective) ||
	                        has_decoration(var.self, DecorationNoPerspective);
	bool is_centroid = has_member_decoration(var_type.self, mbr_idx, DecorationCentroid) ||
	                   has_decoration(var.self, DecorationCentroid);
	bool is_sample =
	    has_member_decoration(var_type.self, mbr_idx, DecorationSample) || has_decoration(var.self, DecorationSample);

	// Add a reference to the member to the interface struct.
	uint32_t mbr_type_id = var_type.member_types[mbr_idx];
	uint32_t ib_mbr_idx = uint32_t(ib_type.member_types.size());
	mbr_type_id = ensure_correct_builtin_type(mbr_type_id, builtin);
	var_type.member_types[mbr_idx] = mbr_type_id;
	if (storage == StorageClassInput && pull_model_inputs.count(var.self))
		ib_type.member_types.push_back(build_msl_interpolant_type(mbr_type_id, is_noperspective));
	else
		ib_type.member_types.push_back(mbr_type_id);

	// Give the member a name
	string mbr_name = ensure_valid_name(append_member_name(mbr_name_qual, var_type, mbr_idx), "m");
	set_member_name(ib_type.self, ib_mbr_idx, mbr_name);

	// Update the original variable reference to include the structure reference
	string qual_var_name = ib_var_ref + "." + mbr_name;
	// If using pull-model interpolation, need to add a call to the correct interpolation method.
	if (storage == StorageClassInput && pull_model_inputs.count(var.self))
	{
		if (is_centroid)
			qual_var_name += ".interpolate_at_centroid()";
		else if (is_sample)
			qual_var_name += join(".interpolate_at_sample(", to_expression(builtin_sample_id_id), ")");
		else
			qual_var_name += ".interpolate_at_center()";
	}

	bool flatten_stage_out = false;
	string var_chain = var_chain_qual + "." + to_member_name(var_type, mbr_idx);
	if (is_builtin && !meta.strip_array)
	{
		// For the builtin gl_PerVertex, we cannot treat it as a block anyways,
		// so redirect to qualified name.
		set_member_qualified_name(var_type.self, mbr_idx, qual_var_name);
	}
	else if (!meta.strip_array && meta.allow_local_declaration)
	{
		// Unflatten or flatten from [[stage_in]] or [[stage_out]] as appropriate.
		switch (storage)
		{
		case StorageClassInput:
			entry_func.fixup_hooks_in.push_back([=]() {
				statement(var_chain, " = ", qual_var_name, ";");
			});
			break;

		case StorageClassOutput:
			flatten_stage_out = true;
			entry_func.fixup_hooks_out.push_back([=]() {
				statement(qual_var_name, " = ", var_chain, ";");
			});
			break;

		default:
			break;
		}
	}

	// Once we determine the location of the first member within nested structures,
	// from a var of the topmost structure, the remaining flattened members of
	// the nested structures will have consecutive location values. At this point,
	// we've recursively tunnelled into structs, arrays, and matrices, and are
	// down to a single location for each member now.
	if (!is_builtin && location != UINT32_MAX)
	{
		set_member_decoration(ib_type.self, ib_mbr_idx, DecorationLocation, location);
		mark_location_as_used_by_shader(location, get<SPIRType>(mbr_type_id), storage);
		location += type_to_location_count(get<SPIRType>(mbr_type_id));
	}
	else if (has_member_decoration(var_type.self, mbr_idx, DecorationLocation))
	{
		location = get_member_decoration(var_type.self, mbr_idx, DecorationLocation);
		uint32_t comp = get_member_decoration(var_type.self, mbr_idx, DecorationComponent);
		if (storage == StorageClassInput)
		{
			mbr_type_id = ensure_correct_input_type(mbr_type_id, location, comp, 0, meta.strip_array);
			var_type.member_types[mbr_idx] = mbr_type_id;
			if (storage == StorageClassInput && pull_model_inputs.count(var.self))
				ib_type.member_types[ib_mbr_idx] = build_msl_interpolant_type(mbr_type_id, is_noperspective);
			else
				ib_type.member_types[ib_mbr_idx] = mbr_type_id;
		}
		set_member_decoration(ib_type.self, ib_mbr_idx, DecorationLocation, location);
		mark_location_as_used_by_shader(location, get<SPIRType>(mbr_type_id), storage);
		location += type_to_location_count(get<SPIRType>(mbr_type_id));
	}
	else if (has_decoration(var.self, DecorationLocation))
	{
		location = get_accumulated_member_location(var, mbr_idx, meta.strip_array);
		if (storage == StorageClassInput)
		{
			mbr_type_id = ensure_correct_input_type(mbr_type_id, location, 0, 0, meta.strip_array);
			var_type.member_types[mbr_idx] = mbr_type_id;
			if (storage == StorageClassInput && pull_model_inputs.count(var.self))
				ib_type.member_types[ib_mbr_idx] = build_msl_interpolant_type(mbr_type_id, is_noperspective);
			else
				ib_type.member_types[ib_mbr_idx] = mbr_type_id;
		}
		set_member_decoration(ib_type.self, ib_mbr_idx, DecorationLocation, location);
		mark_location_as_used_by_shader(location, get<SPIRType>(mbr_type_id), storage);
		location += type_to_location_count(get<SPIRType>(mbr_type_id));
	}
	else if (is_builtin && is_tessellation_shader() && storage == StorageClassInput && inputs_by_builtin.count(builtin))
	{
		location = inputs_by_builtin[builtin].location;
		set_member_decoration(ib_type.self, ib_mbr_idx, DecorationLocation, location);
		mark_location_as_used_by_shader(location, get<SPIRType>(mbr_type_id), storage);
		location += type_to_location_count(get<SPIRType>(mbr_type_id));
	}
	else if (is_builtin && capture_output_to_buffer && storage == StorageClassOutput && outputs_by_builtin.count(builtin))
	{
		location = outputs_by_builtin[builtin].location;
		set_member_decoration(ib_type.self, ib_mbr_idx, DecorationLocation, location);
		mark_location_as_used_by_shader(location, get<SPIRType>(mbr_type_id), storage);
		location += type_to_location_count(get<SPIRType>(mbr_type_id));
	}

	// Copy the component location, if present.
	if (has_member_decoration(var_type.self, mbr_idx, DecorationComponent))
	{
		uint32_t comp = get_member_decoration(var_type.self, mbr_idx, DecorationComponent);
		set_member_decoration(ib_type.self, ib_mbr_idx, DecorationComponent, comp);
	}

	// Mark the member as builtin if needed
	if (is_builtin)
	{
		set_member_decoration(ib_type.self, ib_mbr_idx, DecorationBuiltIn, builtin);
		if (builtin == BuiltInPosition && storage == StorageClassOutput)
			qual_pos_var_name = qual_var_name;
	}

	const SPIRConstant *c = nullptr;
	if (!flatten_stage_out && var.storage == StorageClassOutput &&
	    var.initializer != ID(0) && (c = maybe_get<SPIRConstant>(var.initializer)))
	{
		if (meta.strip_array)
		{
			entry_func.fixup_hooks_in.push_back([=, &var]() {
				auto &type = this->get<SPIRType>(var.basetype);
				uint32_t index = get_extended_member_decoration(var.self, mbr_idx, SPIRVCrossDecorationInterfaceMemberIndex);

				auto invocation = to_tesc_invocation_id();
				auto constant_chain = join(to_expression(var.initializer), "[", invocation, "]");
				statement(to_expression(stage_out_ptr_var_id), "[",
				          invocation, "].",
				          to_member_name(ib_type, index), " = ",
				          constant_chain, ".", to_member_name(type, mbr_idx), ";");
			});
		}
		else
		{
			entry_func.fixup_hooks_in.push_back([=]() {
				statement(qual_var_name, " = ", constant_expression(
						this->get<SPIRConstant>(c->subconstants[mbr_idx])), ";");
			});
		}
	}

	if (storage != StorageClassInput || !pull_model_inputs.count(var.self))
	{
		// Copy interpolation decorations if needed
		if (is_flat)
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationFlat);
		if (is_noperspective)
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationNoPerspective);
		if (is_centroid)
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationCentroid);
		if (is_sample)
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationSample);
	}

	set_extended_member_decoration(ib_type.self, ib_mbr_idx, SPIRVCrossDecorationInterfaceOrigID, var.self);
	set_extended_member_decoration(ib_type.self, ib_mbr_idx, SPIRVCrossDecorationInterfaceMemberIndex, var_mbr_idx);
}